

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

AliasRet aa_escape(jit_State *J,IRIns *ir,IRIns *stop)

{
  IRIns *pIVar1;
  
  pIVar1 = ir + 1;
  while( true ) {
    if (stop <= pIVar1) {
      return ALIAS_NO;
    }
    if (((uint)(pIVar1->field_0).op2 == (uint)((ulong)((long)ir - (long)(J->cur).ir) >> 3)) &&
       ((byte)((pIVar1->field_1).o + 0xb6) < 4)) break;
    pIVar1 = pIVar1 + 1;
  }
  return ALIAS_MAY;
}

Assistant:

static AliasRet aa_escape(jit_State *J, IRIns *ir, IRIns *stop)
{
  IRRef ref = (IRRef)(ir - J->cur.ir);  /* The ref that might be stored. */
  for (ir++; ir < stop; ir++)
    if (ir->op2 == ref &&
	(ir->o == IR_ASTORE || ir->o == IR_HSTORE ||
	 ir->o == IR_USTORE || ir->o == IR_FSTORE))
      return ALIAS_MAY;  /* Reference was stored and might alias. */
  return ALIAS_NO;  /* Reference was not stored. */
}